

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

bool anon_unknown.dwarf_57514da::ParseKeyPath
               (vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *split,
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *out,bool *apostrophe,string *error,bool allow_multipath)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  pointer pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined7 in_register_00000081;
  char *pcVar5;
  long unaff_R13;
  Span<const_char> *pSVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar10;
  string_view separators;
  Span<const_char> elem;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_multipath;
  vector<unsigned_int,_std::allocator<unsigned_int>_> multipath_values;
  KeyPath path;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> nums;
  KeyPath branch_path;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_f0;
  uint *local_b8;
  iterator iStack_b0;
  uint *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  _Storage<unsigned_int,_true> local_80 [2];
  undefined1 local_78 [32];
  string local_58;
  long local_38;
  
  pcVar5 = (char *)CONCAT71(in_register_00000081,allow_multipath);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_a8 = (uint *)0x0;
  local_b8 = (uint *)0x0;
  iStack_b0._M_current = (uint *)0x0;
  local_f0._M_buckets = &local_f0._M_single_bucket;
  local_f0._M_bucket_count = 1;
  local_f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0._M_element_count = 0;
  local_f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0._M_rehash_policy._M_next_resize = 0;
  local_f0._M_single_bucket = (__node_base_ptr)0x0;
  pSVar4 = (split->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if (0x10 < (ulong)((long)(split->
                           super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4)) {
    uVar9 = 1;
    bVar8 = false;
    do {
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar9 * 0x10);
      pcVar1 = *(char **)((long)&(args->_M_dataplus)._M_p + (long)pSVar4);
      sVar2 = *(size_t *)((long)&args->_M_string_length + (long)pSVar4);
      if (((sVar2 != 0) && (*pcVar1 == '<')) && (pcVar1[sVar2 - 1] == '>')) {
        if (allow_multipath) {
          if (bVar8) {
            bVar8 = false;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(error,0,error->_M_string_length,
                       "Multiple multipath key path specifiers found",0x2c);
            goto LAB_00d84d42;
          }
          local_58._M_dataplus._M_p = (pointer)((long)pcVar1 + 1);
          local_58._M_string_length =
               (size_type)(pcVar1 + ((sVar2 - 1) - (long)local_58._M_dataplus._M_p));
          separators._M_str = pcVar5;
          separators._M_len = (size_t)";";
          util::Split<Span<char_const>>
                    ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_78,
                     (util *)&local_58,(Span<const_char> *)0x1,separators);
          uVar3 = local_78._8_8_;
          pSVar6 = (Span<const_char> *)local_78._0_8_;
          if (0x10 < (ulong)(local_78._8_8_ - local_78._0_8_)) {
            for (; pSVar6 != (Span<const_char> *)uVar3; pSVar6 = pSVar6 + 1) {
              local_80 = (_Storage<unsigned_int,_true>  [2])
                         ParseKeyPathNum(*pSVar6,apostrophe,error);
              if (((ulong)local_80 & 0x100000000) == 0) goto LAB_00d84d22;
              local_58._M_dataplus._M_p = (pointer)&local_f0;
              pVar10 = std::
                       _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       ::
                       _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                 ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                   *)local_58._M_dataplus._M_p,local_80,&local_58);
              if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                tinyformat::format<unsigned_int>
                          (&local_58,"Duplicated key path value %u in multipath specifier",
                           &local_80[0]._M_value);
                _GLOBAL__N_1::ParseKeyPath();
                goto LAB_00d84d22;
              }
              if (iStack_b0._M_current == local_a8) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_b8,iStack_b0,
                           &local_80[0]._M_value);
              }
              else {
                *iStack_b0._M_current = (uint)local_80[0];
                iStack_b0._M_current = iStack_b0._M_current + 1;
              }
            }
            if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<>
                        (&local_98,
                         (iterator)
                         local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
            }
            else {
              *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            lVar7 = (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            if ((Span<const_char> *)local_78._0_8_ != (Span<const_char> *)0x0) {
              operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
            }
            unaff_R13 = (lVar7 >> 2) + -1;
            bVar8 = true;
            goto LAB_00d84c04;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(error,0,error->_M_string_length,
                     "Multipath key path specifiers must have at least two items",0x3a);
LAB_00d84d22:
          if ((Span<const_char> *)local_78._0_8_ != (Span<const_char> *)0x0) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
          }
        }
        else {
          local_78._0_8_ = local_78 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar1,pcVar1 + sVar2);
          tinyformat::format<std::__cxx11::string>
                    (&local_58,
                     (tinyformat *)
                     "Key path value \'%s\' specifies multipath in a section where multipath is not allowed"
                     ,local_78,args);
          _GLOBAL__N_1::ParseKeyPath();
        }
LAB_00d84d3f:
        bVar8 = false;
        goto LAB_00d84d42;
      }
      elem.m_size = sVar2;
      elem.m_data = pcVar1;
      local_58._M_dataplus._M_p = (pointer)ParseKeyPathNum(elem,apostrophe,error);
      if (((ulong)local_58._M_dataplus._M_p & 0x100000000) == 0) goto LAB_00d84d3f;
      if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_58);
      }
      else {
        *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = (uint)local_58._M_dataplus._M_p;
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
LAB_00d84c04:
      uVar9 = uVar9 + 1;
      pSVar4 = (split->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(split->
                                   super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 4))
    ;
    if (bVar8) {
      bVar8 = true;
      if (iStack_b0._M_current != local_b8) {
        uVar9 = 0;
        do {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_98);
          *(uint *)((long)local_58._M_dataplus._M_p + unaff_R13 * 4) = local_b8[uVar9];
          std::
          vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      *)out,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
          if ((_Optional_payload_base<unsigned_int>)local_58._M_dataplus._M_p !=
              (_Optional_payload_base<unsigned_int>)0x0) {
            operator_delete(local_58._M_dataplus._M_p,
                            local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p
                           );
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)((long)iStack_b0._M_current - (long)local_b8 >> 2));
      }
      goto LAB_00d84d42;
    }
  }
  bVar8 = true;
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)out,&local_98);
LAB_00d84d42:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_f0);
  if (local_b8 != (uint *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

[[nodiscard]] bool ParseKeyPath(const std::vector<Span<const char>>& split, std::vector<KeyPath>& out, bool& apostrophe, std::string& error, bool allow_multipath)
{
    KeyPath path;
    std::optional<size_t> multipath_segment_index;
    std::vector<uint32_t> multipath_values;
    std::unordered_set<uint32_t> seen_multipath;

    for (size_t i = 1; i < split.size(); ++i) {
        const Span<const char>& elem = split[i];

        // Check if element contain multipath specifier
        if (!elem.empty() && elem.front() == '<' && elem.back() == '>') {
            if (!allow_multipath) {
                error = strprintf("Key path value '%s' specifies multipath in a section where multipath is not allowed", std::string(elem.begin(), elem.end()));
                return false;
            }
            if (multipath_segment_index) {
                error = "Multiple multipath key path specifiers found";
                return false;
            }

            // Parse each possible value
            std::vector<Span<const char>> nums = Split(Span(elem.begin()+1, elem.end()-1), ";");
            if (nums.size() < 2) {
                error = "Multipath key path specifiers must have at least two items";
                return false;
            }

            for (const auto& num : nums) {
                const auto& op_num = ParseKeyPathNum(num, apostrophe, error);
                if (!op_num) return false;
                auto [_, inserted] = seen_multipath.insert(*op_num);
                if (!inserted) {
                    error = strprintf("Duplicated key path value %u in multipath specifier", *op_num);
                    return false;
                }
                multipath_values.emplace_back(*op_num);
            }

            path.emplace_back(); // Placeholder for multipath segment
            multipath_segment_index = path.size()-1;
        } else {
            const auto& op_num = ParseKeyPathNum(elem, apostrophe, error);
            if (!op_num) return false;
            path.emplace_back(*op_num);
        }
    }

    if (!multipath_segment_index) {
        out.emplace_back(std::move(path));
    } else {
        // Replace the multipath placeholder with each value while generating paths
        for (size_t i = 0; i < multipath_values.size(); i++) {
            KeyPath branch_path = path;
            branch_path[*multipath_segment_index] = multipath_values[i];
            out.emplace_back(std::move(branch_path));
        }
    }
    return true;
}